

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

Image * Image_Function_Helper::Normalize(NormalizeForm4 normalize,Image *in)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ImageTemplate<unsigned_char> *in_RDX;
  code *in_RSI;
  ImageTemplate<unsigned_char> *in_RDI;
  Image *out;
  ImageTemplate<unsigned_char> *this;
  undefined8 in_stack_ffffffffffffffc0;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffc8;
  
  this = in_RDI;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(in_RDI);
  PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDX);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDX);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (in_stack_ffffffffffffffc8,(uint32_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
             (uint32_t)in_stack_ffffffffffffffc0,(uint8_t)((ulong)this >> 0x38),
             (uint8_t)((ulong)this >> 0x30));
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(this);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(this);
  (*in_RSI)(in_RDX,0,0,this,0,0,uVar1,uVar2);
  return in_RDI;
}

Assistant:

Image Normalize( FunctionTable::NormalizeForm4 normalize,
                     const Image & in )
    {
        Image_Function::ParameterValidation( in );

        Image out = in.generate( in.width(), in.height() );

        normalize( in, 0, 0, out, 0, 0, out.width(), out.height() );

        return out;
    }